

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O3

void __thiscall spvtools::opt::RegisterLiveness::Analyze(RegisterLiveness *this,Function *f)

{
  DefUseManager **ppDVar1;
  pointer puVar2;
  BasicBlock *pBVar3;
  Instruction *pIVar4;
  pointer ppLVar5;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  undefined8 *puVar6;
  pointer pOVar7;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var8;
  RegisterLiveness *pRVar9;
  bool bVar10;
  char cVar11;
  Analysis AVar12;
  uint32_t uVar13;
  int32_t iVar14;
  iterator iVar15;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var16;
  __node_base _Var17;
  CFG *pCVar18;
  pointer pOVar19;
  IRContext *pIVar20;
  pointer puVar21;
  pointer ppLVar22;
  IRContext *this_01;
  size_t reg_count;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  die_in_block;
  __node_base local_108;
  ComputeRegisterLiveness local_100;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  ComputeRegisterLiveness CStack_98;
  code *local_60;
  undefined8 local_58;
  __buckets_ptr local_50;
  size_type local_48;
  code *local_40;
  code *local_38;
  
  std::__detail::
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>_>_>
  ::_M_deallocate_nodes
            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>_>_>
              *)&this->block_pressure_,
             (__node_ptr)(this->block_pressure_)._M_h._M_before_begin._M_nxt);
  memset((this->block_pressure_)._M_h._M_buckets,0,(this->block_pressure_)._M_h._M_bucket_count << 3
        );
  (this->block_pressure_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_pressure_)._M_h._M_element_count = 0;
  pIVar20 = this->context_;
  AVar12 = pIVar20->valid_analyses_;
  this_01 = pIVar20;
  local_100.reg_pressure_ = this;
  local_100.context_ = pIVar20;
  local_100.function_ = f;
  if ((AVar12 & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar20);
    this_01 = this->context_;
    AVar12 = this_01->valid_analyses_;
  }
  local_100.cfg_ =
       (pIVar20->cfg_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
       super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar20 = this_01;
  if ((AVar12 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_01);
    pIVar20 = this->context_;
  }
  local_100.def_use_manager_ =
       (this_01->def_use_mgr_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_100.dom_tree_ = (DominatorTree *)IRContext::GetDominatorAnalysis(pIVar20,f);
  local_100.loop_desc_ = IRContext::GetLoopDescriptor(this->context_,f);
  puVar21 = (f->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (f->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar21 != puVar2) {
    do {
      pRVar9 = local_100.reg_pressure_;
      pBVar3 = (puVar21->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pIVar4 = (pBVar3->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar13 = 0;
      if (pIVar4->has_result_id_ == true) {
        uVar13 = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
      }
      local_c8._0_4_ = uVar13;
      iVar15 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(pRVar9->block_pressure_)._M_h,(key_type_conflict *)local_c8._M_pod_data);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_c8._8_8_ = 0;
        local_c8._M_unused._M_object = &local_100;
        pcStack_b0 = std::
                     _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:84:47)>
                     ::_M_invoke;
        local_b8 = std::
                   _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:84:47)>
                   ::_M_manager;
        CFG::ForEachBlockInPostOrder
                  (local_100.cfg_,pBVar3,(function<void_(spvtools::opt::BasicBlock_*)> *)&local_c8);
        if (local_b8 != (code *)0x0) {
          (*local_b8)(&local_c8,&local_c8,3);
        }
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar2);
  }
  ppLVar22 = ((local_100.loop_desc_)->placeholder_top_loop_).nested_loops_.
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = ((local_100.loop_desc_)->placeholder_top_loop_).nested_loops_.
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar22 != ppLVar5) {
    do {
      anon_unknown_8::ComputeRegisterLiveness::DoLoopLivenessUnification(&local_100,*ppLVar22);
      ppLVar22 = ppLVar22 + 1;
    } while (ppLVar22 != ppLVar5);
  }
  CStack_98.function_ =
       (Function *)
       ((local_100.function_)->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  CStack_98.context_ =
       (IRContext *)
       ((local_100.function_)->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((IRContext *)CStack_98.function_ != CStack_98.context_) {
    ppDVar1 = &CStack_98.def_use_manager_;
    do {
      pRVar9 = local_100.reg_pressure_;
      pBVar3 = (((__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                  *)&((IRContext *)CStack_98.function_)->syntax_context_)->
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               )._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      this_00.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (pBVar3->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ;
      uVar13 = 0;
      if (*(bool *)((long)this_00.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x2d) == true) {
        uVar13 = Instruction::GetSingleWordOperand
                           ((Instruction *)
                            this_00.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                            ,(uint)*(bool *)((long)this_00.
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
      }
      local_c8._0_4_ = uVar13;
      iVar15 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(pRVar9->block_pressure_)._M_h,(key_type_conflict *)local_c8._M_pod_data);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0xd6,
                      "void spvtools::opt::(anonymous namespace)::ComputeRegisterLiveness::EvaluateRegisterRequirements()"
                     );
      }
      local_108._M_nxt =
           *(_Hash_node_base **)
            ((long)iVar15.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                   ._M_cur + 0x60);
      for (puVar6 = *(undefined8 **)
                     ((long)iVar15.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                            ._M_cur + 0x58); puVar6 != (undefined8 *)0x0;
          puVar6 = (undefined8 *)*puVar6) {
        RegionRegisterLiveness::AddRegisterClass
                  ((RegionRegisterLiveness *)
                   ((long)iVar15.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                          ._M_cur + 0x10),(Instruction *)puVar6[1]);
      }
      *(_Hash_node_base **)
       ((long)iVar15.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
              ._M_cur + 0x80) = local_108._M_nxt;
      local_c8._M_unused._M_object = &CStack_98;
      local_c8._8_8_ = 1;
      local_b8 = (code *)0x0;
      pcStack_b0 = (code *)0x0;
      local_a8 = 0x3f800000;
      local_a0 = 0;
      CStack_98.reg_pressure_ = (RegisterLiveness *)0x0;
      CStack_98.cfg_ =
           *(CFG **)((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
      ;
      pCVar18 = (CFG *)((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8)
      ;
      if (pCVar18 != CStack_98.cfg_) {
        do {
          pIVar4 = (Instruction *)(pCVar18->block2structured_succs_)._M_h._M_bucket_count;
          if (pIVar4->opcode_ == OpPhi) break;
          local_48 = 0;
          local_50 = (__buckets_ptr)operator_new(0x20);
          *local_50 = (__node_base_ptr)
                      ((long)iVar15.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                             ._M_cur + 0x10);
          local_50[1] = (__node_base_ptr)&local_c8;
          local_50[2] = &local_108;
          local_50[3] = (__node_base_ptr)&local_100;
          local_38 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:231:13)>
                     ::_M_invoke;
          local_40 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:231:13)>
                     ::_M_manager;
          CStack_98.dom_tree_ = (DominatorTree *)0x0;
          CStack_98.def_use_manager_ = (DefUseManager *)&stack0xffffffffffffffb0;
          local_60 = std::
                     _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                     ::_M_invoke;
          CStack_98.loop_desc_ =
               (LoopDescriptor *)
               std::
               _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
               ::_M_manager;
          pOVar19 = *(pointer *)
                     &(pIVar4->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl;
          pOVar7 = *(pointer *)
                    ((long)&(pIVar4->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    + 8);
          if (pOVar19 == pOVar7) {
LAB_005c100d:
            (*(code *)CStack_98.loop_desc_)(ppDVar1,ppDVar1,3);
          }
          else {
            do {
              bVar10 = spvIsInIdType(pOVar19->type);
              if (bVar10) {
                _Var8._M_head_impl =
                     *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                      &(pOVar19->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ;
                _Var16._M_head_impl =
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &(pOVar19->words).small_data_;
                if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )_Var8._M_head_impl !=
                    (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     )0x0) {
                  _Var16._M_head_impl = _Var8._M_head_impl;
                }
                local_58 = *(undefined8 *)_Var16._M_head_impl;
                if (CStack_98.loop_desc_ == (LoopDescriptor *)0x0) {
                  std::__throw_bad_function_call();
                }
                cVar11 = (*local_60)(ppDVar1,&local_58);
                if (cVar11 == '\0') break;
              }
              pOVar19 = pOVar19 + 1;
            } while (pOVar19 != pOVar7);
            if (CStack_98.loop_desc_ != (LoopDescriptor *)0x0) goto LAB_005c100d;
          }
          if ((_Hash_node_base *)local_40 != (_Hash_node_base *)0x0) {
            (*local_40)(&stack0xffffffffffffffb0,&stack0xffffffffffffffb0,3);
          }
          _Var17._M_nxt = local_108._M_nxt;
          if (local_108._M_nxt <
              *(_Hash_node_base **)
               ((long)iVar15.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                      ._M_cur + 0x80)) {
            _Var17._M_nxt =
                 *(_Hash_node_base **)
                  ((long)iVar15.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                         ._M_cur + 0x80);
          }
          *(_Hash_node_base **)
           ((long)iVar15.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                  ._M_cur + 0x80) = _Var17._M_nxt;
          if ((((pIVar4->has_result_id_ == true) && (pIVar4->opcode_ != OpUndef)) &&
              (iVar14 = spvOpcodeIsConstant(pIVar4->opcode_), iVar14 == 0)) &&
             (pIVar4->opcode_ != OpLabel)) {
            local_108._M_nxt = (_Hash_node_base *)((long)&local_108._M_nxt[-1]._M_nxt + 7);
          }
          pCVar18 = (CFG *)(pCVar18->block2structured_succs_)._M_h._M_bucket_count;
        } while (pCVar18 != CStack_98.cfg_);
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_c8);
      CStack_98.function_ = (Function *)&(CStack_98.function_)->params_;
    } while ((IRContext *)CStack_98.function_ != CStack_98.context_);
  }
  return;
}

Assistant:

void RegisterLiveness::Analyze(Function* f) {
  block_pressure_.clear();
  ComputeRegisterLiveness(this, f).Compute();
}